

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O1

void av1_lowbd_fwd_txfm2d_32x32_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  int32_t *piVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined8 uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  int8_t *piVar26;
  int16_t *piVar27;
  uint uVar28;
  undefined7 in_register_00000009;
  long lVar29;
  undefined8 *puVar30;
  int32_t *piVar31;
  ulong uVar32;
  long lVar33;
  undefined8 *puVar34;
  undefined4 uVar35;
  undefined1 auVar37 [12];
  undefined1 auVar40 [16];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar45 [16];
  undefined4 uVar46;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined4 uVar92;
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined4 uVar125;
  undefined1 auVar127 [12];
  undefined1 auVar128 [12];
  undefined1 auVar129 [12];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar147 [16];
  __m128i buf0 [32];
  __m128i buf1 [128];
  code *local_a48 [2];
  undefined8 local_a38 [2];
  undefined2 local_a28;
  undefined2 uStack_a26;
  undefined2 uStack_a24;
  undefined2 uStack_a22;
  undefined2 uStack_a20;
  undefined2 uStack_a1e;
  undefined2 uStack_a1c;
  undefined2 uStack_a1a;
  undefined1 local_a18 [16];
  undefined2 local_a08;
  undefined2 uStack_a06;
  undefined2 uStack_a04;
  undefined2 uStack_a02;
  undefined2 uStack_a00;
  undefined2 uStack_9fe;
  undefined2 uStack_9fc;
  undefined2 uStack_9fa;
  undefined1 local_9f8 [16];
  undefined2 local_9e8;
  undefined2 uStack_9e6;
  undefined2 uStack_9e4;
  undefined2 uStack_9e2;
  undefined2 uStack_9e0;
  undefined2 uStack_9de;
  undefined2 uStack_9dc;
  undefined2 uStack_9da;
  undefined1 local_9d8 [16];
  undefined2 local_9c8;
  undefined2 uStack_9c6;
  undefined2 uStack_9c4;
  undefined2 uStack_9c2;
  undefined2 uStack_9c0;
  undefined2 uStack_9be;
  undefined2 uStack_9bc;
  undefined2 uStack_9ba;
  undefined1 local_9b8 [16];
  undefined2 local_9a8;
  undefined2 uStack_9a6;
  undefined2 uStack_9a4;
  undefined2 uStack_9a2;
  undefined2 uStack_9a0;
  undefined2 uStack_99e;
  undefined2 uStack_99c;
  undefined2 uStack_99a;
  undefined1 local_998 [16];
  undefined2 local_988;
  undefined2 uStack_986;
  undefined2 uStack_984;
  undefined2 uStack_982;
  undefined2 uStack_980;
  undefined2 uStack_97e;
  undefined2 uStack_97c;
  undefined2 uStack_97a;
  undefined1 local_978 [16];
  undefined2 local_968;
  undefined2 uStack_966;
  undefined2 uStack_964;
  undefined2 uStack_962;
  undefined2 uStack_960;
  undefined2 uStack_95e;
  undefined2 uStack_95c;
  undefined2 uStack_95a;
  undefined1 local_958 [16];
  undefined2 local_948;
  undefined2 uStack_946;
  undefined2 uStack_944;
  undefined2 uStack_942;
  undefined2 uStack_940;
  undefined2 uStack_93e;
  undefined2 uStack_93c;
  undefined2 uStack_93a;
  undefined1 local_938 [16];
  undefined2 local_928;
  undefined2 uStack_926;
  undefined2 uStack_924;
  undefined2 uStack_922;
  undefined2 uStack_920;
  undefined2 uStack_91e;
  undefined2 uStack_91c;
  undefined2 uStack_91a;
  undefined1 local_918 [16];
  undefined2 local_908;
  undefined2 uStack_906;
  undefined2 uStack_904;
  undefined2 uStack_902;
  undefined2 uStack_900;
  undefined2 uStack_8fe;
  undefined2 uStack_8fc;
  undefined2 uStack_8fa;
  undefined1 local_8f8 [16];
  undefined2 local_8e8;
  undefined2 uStack_8e6;
  undefined2 uStack_8e4;
  undefined2 uStack_8e2;
  undefined2 uStack_8e0;
  undefined2 uStack_8de;
  undefined2 uStack_8dc;
  undefined2 uStack_8da;
  undefined1 local_8d8 [16];
  undefined2 local_8c8;
  undefined2 uStack_8c6;
  undefined2 uStack_8c4;
  undefined2 uStack_8c2;
  undefined2 uStack_8c0;
  undefined2 uStack_8be;
  undefined2 uStack_8bc;
  undefined2 uStack_8ba;
  undefined1 local_8b8 [16];
  undefined2 local_8a8;
  undefined2 uStack_8a6;
  undefined2 uStack_8a4;
  undefined2 uStack_8a2;
  undefined2 uStack_8a0;
  undefined2 uStack_89e;
  undefined2 uStack_89c;
  undefined2 uStack_89a;
  undefined1 local_898 [16];
  undefined2 local_888;
  undefined2 uStack_886;
  undefined2 uStack_884;
  undefined2 uStack_882;
  undefined2 uStack_880;
  undefined2 uStack_87e;
  undefined2 uStack_87c;
  undefined2 uStack_87a;
  undefined1 local_878 [16];
  undefined2 local_868;
  undefined2 uStack_866;
  undefined2 uStack_864;
  undefined2 uStack_862;
  undefined2 uStack_860;
  undefined2 uStack_85e;
  undefined2 uStack_85c;
  undefined2 uStack_85a;
  undefined1 local_858 [16];
  undefined2 local_848;
  undefined2 uStack_846;
  undefined2 uStack_844;
  undefined2 uStack_842;
  undefined2 uStack_840;
  undefined2 uStack_83e;
  undefined2 uStack_83c;
  undefined2 uStack_83a;
  undefined8 local_838 [4];
  undefined8 uStack_818;
  undefined4 auStack_810 [6];
  undefined8 uStack_7f8;
  undefined8 auStack_7f0 [3];
  undefined8 uStack_7d8;
  undefined4 auStack_7d0 [102];
  undefined8 local_638 [4];
  undefined8 uStack_618;
  undefined4 auStack_610 [6];
  undefined8 uStack_5f8;
  undefined8 auStack_5f0 [3];
  undefined8 uStack_5d8;
  undefined4 auStack_5d0 [102];
  undefined8 auStack_438 [4];
  undefined8 uStack_418;
  undefined4 auStack_410 [6];
  undefined8 uStack_3f8;
  undefined8 auStack_3f0 [3];
  undefined8 uStack_3d8;
  undefined4 auStack_3d0 [102];
  undefined8 auStack_238 [4];
  undefined8 uStack_218;
  undefined4 auStack_210 [6];
  undefined8 uStack_1f8;
  undefined8 auStack_1f0 [3];
  undefined8 uStack_1d8;
  undefined4 auStack_1d0 [104];
  undefined1 auVar36 [12];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar47 [12];
  undefined1 auVar57 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [12];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar126 [12];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar139 [16];
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar148 [16];
  undefined1 auVar140 [16];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  
  piVar26 = av1_fwd_txfm_shift_ls[3];
  if ((0xe01UL >> ((ulong)tx_type & 0x3f) & 1) != 0) {
    uVar32 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
    local_a48[0] = *(code **)((long)col_txfm8x32_arr + uVar32);
    local_a48[1] = *(code **)((long)row_txfm8x32_arr + uVar32);
    lVar33 = 0;
    do {
      if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
        lVar29 = 0x200;
        piVar27 = input;
        do {
          uVar8 = *(undefined8 *)(piVar27 + 4);
          *(undefined8 *)((long)local_a48 + lVar29) = *(undefined8 *)piVar27;
          *(undefined8 *)((long)local_a48 + lVar29 + 8) = uVar8;
          piVar27 = piVar27 + stride;
          lVar29 = lVar29 + -0x10;
        } while (lVar29 != 0);
      }
      else {
        lVar29 = 0;
        piVar27 = input;
        do {
          uVar8 = *(undefined8 *)(piVar27 + 4);
          *(undefined8 *)((long)local_a38 + lVar29) = *(undefined8 *)piVar27;
          *(undefined8 *)((long)local_a38 + lVar29 + 8) = uVar8;
          lVar29 = lVar29 + 0x10;
          piVar27 = piVar27 + stride;
        } while (lVar29 != 0x200);
      }
      bVar3 = *piVar26;
      uVar28 = (uint)(char)bVar3;
      if ((int)uVar28 < 0) {
        auVar40 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
        auVar40 = pshuflw(auVar40,auVar40,0);
        auVar40._4_4_ = auVar40._0_4_;
        auVar40._8_4_ = auVar40._0_4_;
        auVar40._12_4_ = auVar40._0_4_;
        lVar29 = 0;
        do {
          auVar59 = paddsw(*(undefined1 (*) [16])((long)local_a38 + lVar29),auVar40);
          auVar59 = psraw(auVar59,ZEXT416(-uVar28));
          *(undefined1 (*) [16])((long)local_a38 + lVar29) = auVar59;
          lVar29 = lVar29 + 0x10;
        } while (lVar29 != 0x200);
      }
      else if (bVar3 != 0) {
        lVar29 = 0;
        do {
          auVar40 = psllw(*(undefined1 (*) [16])((long)local_a38 + lVar29),ZEXT416(uVar28));
          *(undefined1 (*) [16])((long)local_a38 + lVar29) = auVar40;
          lVar29 = lVar29 + 0x10;
        } while (lVar29 != 0x200);
      }
      (*local_a48[0])(local_a38,local_a38,0xc);
      bVar3 = piVar26[1];
      uVar28 = (uint)(char)bVar3;
      if ((int)uVar28 < 0) {
        auVar40 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
        auVar40 = pshuflw(auVar40,auVar40,0);
        auVar59._0_4_ = auVar40._0_4_;
        auVar59._4_4_ = auVar59._0_4_;
        auVar59._8_4_ = auVar59._0_4_;
        auVar59._12_4_ = auVar59._0_4_;
        lVar29 = 0;
        do {
          auVar40 = paddsw(*(undefined1 (*) [16])((long)local_a38 + lVar29),auVar59);
          auVar40 = psraw(auVar40,ZEXT416(-uVar28));
          *(undefined1 (*) [16])((long)local_a38 + lVar29) = auVar40;
          lVar29 = lVar29 + 0x10;
        } while (lVar29 != 0x200);
      }
      else if (bVar3 != 0) {
        lVar29 = 0;
        do {
          auVar40 = psllw(*(undefined1 (*) [16])((long)local_a38 + lVar29),ZEXT416(uVar28));
          *(undefined1 (*) [16])((long)local_a38 + lVar29) = auVar40;
          lVar29 = lVar29 + 0x10;
        } while (lVar29 != 0x200);
      }
      lVar29 = lVar33 * 0x80;
      auVar63._0_12_ = local_a38._0_12_;
      auVar63._12_2_ = local_a38[0]._6_2_;
      auVar63._14_2_ = uStack_a22;
      auVar62._12_4_ = auVar63._12_4_;
      auVar62._0_10_ = local_a38._0_10_;
      auVar62._10_2_ = uStack_a24;
      auVar61._10_6_ = auVar62._10_6_;
      auVar61._0_8_ = local_a38[0];
      auVar61._8_2_ = local_a38[0]._4_2_;
      auVar9._4_8_ = auVar61._8_8_;
      auVar9._2_2_ = uStack_a26;
      auVar9._0_2_ = local_a38[0]._2_2_;
      auVar60._0_4_ = CONCAT22(local_a28,(short)local_a38[0]);
      auVar60._4_12_ = auVar9;
      auVar111._0_12_ = local_a18._0_12_;
      auVar111._12_2_ = local_a18._6_2_;
      auVar111._14_2_ = uStack_a02;
      auVar110._12_4_ = auVar111._12_4_;
      auVar110._0_10_ = local_a18._0_10_;
      auVar110._10_2_ = uStack_a04;
      auVar109._10_6_ = auVar110._10_6_;
      auVar109._0_8_ = local_a18._0_8_;
      auVar109._8_2_ = local_a18._4_2_;
      auVar10._4_8_ = auVar109._8_8_;
      auVar10._2_2_ = uStack_a06;
      auVar10._0_2_ = local_a18._2_2_;
      auVar79._0_12_ = local_9f8._0_12_;
      auVar79._12_2_ = local_9f8._6_2_;
      auVar79._14_2_ = uStack_9e2;
      auVar78._12_4_ = auVar79._12_4_;
      auVar78._0_10_ = local_9f8._0_10_;
      auVar78._10_2_ = uStack_9e4;
      auVar77._10_6_ = auVar78._10_6_;
      auVar77._0_8_ = local_9f8._0_8_;
      auVar77._8_2_ = local_9f8._4_2_;
      auVar11._4_8_ = auVar77._8_8_;
      auVar11._2_2_ = uStack_9e6;
      auVar11._0_2_ = local_9f8._2_2_;
      auVar76._0_4_ = CONCAT22(local_9e8,local_9f8._0_2_);
      auVar76._4_12_ = auVar11;
      auVar140._0_12_ = local_9d8._0_12_;
      auVar140._12_2_ = local_9d8._6_2_;
      auVar140._14_2_ = uStack_9c2;
      auVar139._12_4_ = auVar140._12_4_;
      auVar139._0_10_ = local_9d8._0_10_;
      auVar139._10_2_ = uStack_9c4;
      auVar138._10_6_ = auVar139._10_6_;
      auVar138._0_8_ = local_9d8._0_8_;
      auVar138._8_2_ = local_9d8._4_2_;
      auVar12._4_8_ = auVar138._8_8_;
      auVar12._2_2_ = uStack_9c6;
      auVar12._0_2_ = local_9d8._2_2_;
      uVar35 = CONCAT22(uStack_a20,(short)local_a38[1]);
      auVar36._0_8_ = CONCAT26(uStack_a1e,CONCAT24(local_a38[1]._2_2_,uVar35));
      auVar36._8_2_ = local_a38[1]._4_2_;
      auVar36._10_2_ = uStack_a1c;
      auVar41._12_2_ = local_a38[1]._6_2_;
      auVar41._0_12_ = auVar36;
      auVar41._14_2_ = uStack_a1a;
      uVar92 = CONCAT22(uStack_a00,local_a18._8_2_);
      auVar93._0_8_ = CONCAT26(uStack_9fe,CONCAT24(local_a18._10_2_,uVar92));
      auVar93._8_2_ = local_a18._12_2_;
      auVar93._10_2_ = uStack_9fc;
      auVar97._12_2_ = local_a18._14_2_;
      auVar97._0_12_ = auVar93;
      auVar97._14_2_ = uStack_9fa;
      uVar46 = CONCAT22(uStack_9e0,local_9f8._8_2_);
      auVar47._0_8_ = CONCAT26(uStack_9de,CONCAT24(local_9f8._10_2_,uVar46));
      auVar47._8_2_ = local_9f8._12_2_;
      auVar47._10_2_ = uStack_9dc;
      auVar51._12_2_ = local_9f8._14_2_;
      auVar51._0_12_ = auVar47;
      auVar51._14_2_ = uStack_9da;
      uVar125 = CONCAT22(uStack_9c0,local_9d8._8_2_);
      auVar126._0_8_ = CONCAT26(uStack_9be,CONCAT24(local_9d8._10_2_,uVar125));
      auVar126._8_2_ = local_9d8._12_2_;
      auVar126._10_2_ = uStack_9bc;
      auVar130._12_2_ = local_9d8._14_2_;
      auVar130._0_12_ = auVar126;
      auVar130._14_2_ = uStack_9ba;
      auVar101._0_8_ = auVar60._0_8_;
      auVar101._8_4_ = auVar9._0_4_;
      auVar101._12_4_ = auVar10._0_4_;
      auVar105._0_8_ = auVar76._0_8_;
      auVar105._8_4_ = auVar11._0_4_;
      auVar105._12_4_ = auVar12._0_4_;
      auVar121._8_4_ = (int)((ulong)auVar36._0_8_ >> 0x20);
      auVar121._0_8_ = auVar36._0_8_;
      auVar121._12_4_ = (int)((ulong)auVar93._0_8_ >> 0x20);
      auVar134._8_4_ = (int)((ulong)auVar47._0_8_ >> 0x20);
      auVar134._0_8_ = auVar47._0_8_;
      auVar134._12_4_ = (int)((ulong)auVar126._0_8_ >> 0x20);
      local_838[lVar33 * 0x10] = CONCAT44(CONCAT22(local_a08,local_a18._0_2_),auVar60._0_4_);
      local_838[lVar33 * 0x10 + 1] = CONCAT44(CONCAT22(local_9c8,local_9d8._0_2_),auVar76._0_4_);
      local_838[lVar33 * 0x10 + 2] = auVar101._8_8_;
      (&uStack_818)[lVar33 * 0x10 + -1] = auVar105._8_8_;
      *(int *)(&uStack_818 + lVar33 * 0x10) = auVar61._8_4_;
      *(int *)((long)&uStack_818 + (lVar33 * 0x20 + 1) * 4) = auVar109._8_4_;
      *(int *)(&uStack_818 + lVar33 * 0x10 + 1) = auVar77._8_4_;
      *(int *)((long)&uStack_818 + (lVar33 * 0x20 + 3) * 4) = auVar138._8_4_;
      *(undefined4 *)(&uStack_818 + lVar33 * 0x10 + 3) = auVar62._12_4_;
      *(undefined4 *)((long)&uStack_818 + (lVar33 * 0x20 + 7) * 4) = auVar110._12_4_;
      *(undefined4 *)(&uStack_7f8 + lVar33 * 0x10) = auVar78._12_4_;
      *(undefined4 *)((long)&uStack_7f8 + lVar29 + 4) = auVar139._12_4_;
      (&uStack_7f8)[lVar33 * 0x10] = CONCAT44(uVar92,uVar35);
      auStack_7f0[lVar33 * 0x10] = CONCAT44(uVar125,uVar46);
      auStack_7f0[lVar33 * 0x10 + 1] = auVar121._8_8_;
      (&uStack_7d8)[lVar33 * 0x10 + -1] = auVar134._8_8_;
      *(int *)(&uStack_7d8 + lVar33 * 0x10) = auVar36._8_4_;
      *(int *)((long)&uStack_7d8 + (lVar33 * 0x20 + 1) * 4) = auVar93._8_4_;
      *(int *)(&uStack_7d8 + lVar33 * 0x10 + 1) = auVar47._8_4_;
      *(int *)((long)&uStack_7d8 + (lVar33 * 0x20 + 3) * 4) = auVar126._8_4_;
      *(int *)(&uStack_7d8 + lVar33 * 0x10 + 3) = auVar41._12_4_;
      *(int *)((long)&uStack_7d8 + (lVar33 * 0x20 + 7) * 4) = auVar97._12_4_;
      *(int *)(&uStack_7d8 + lVar33 * 0x10 + 4) = auVar51._12_4_;
      *(int *)((long)&uStack_7d8 + (lVar33 * 0x20 + 9) * 4) = auVar130._12_4_;
      auVar67._0_12_ = local_9b8._0_12_;
      auVar67._12_2_ = local_9b8._6_2_;
      auVar67._14_2_ = uStack_9a2;
      auVar66._12_4_ = auVar67._12_4_;
      auVar66._0_10_ = local_9b8._0_10_;
      auVar66._10_2_ = uStack_9a4;
      auVar65._10_6_ = auVar66._10_6_;
      auVar65._0_8_ = local_9b8._0_8_;
      auVar65._8_2_ = local_9b8._4_2_;
      auVar13._4_8_ = auVar65._8_8_;
      auVar13._2_2_ = uStack_9a6;
      auVar13._0_2_ = local_9b8._2_2_;
      auVar64._0_4_ = CONCAT22(local_9a8,local_9b8._0_2_);
      auVar64._4_12_ = auVar13;
      auVar114._0_12_ = local_998._0_12_;
      auVar114._12_2_ = local_998._6_2_;
      auVar114._14_2_ = uStack_982;
      auVar113._12_4_ = auVar114._12_4_;
      auVar113._0_10_ = local_998._0_10_;
      auVar113._10_2_ = uStack_984;
      auVar112._10_6_ = auVar113._10_6_;
      auVar112._0_8_ = local_998._0_8_;
      auVar112._8_2_ = local_998._4_2_;
      auVar14._4_8_ = auVar112._8_8_;
      auVar14._2_2_ = uStack_986;
      auVar14._0_2_ = local_998._2_2_;
      auVar83._0_12_ = local_978._0_12_;
      auVar83._12_2_ = local_978._6_2_;
      auVar83._14_2_ = uStack_962;
      auVar82._12_4_ = auVar83._12_4_;
      auVar82._0_10_ = local_978._0_10_;
      auVar82._10_2_ = uStack_964;
      auVar81._10_6_ = auVar82._10_6_;
      auVar81._0_8_ = local_978._0_8_;
      auVar81._8_2_ = local_978._4_2_;
      auVar15._4_8_ = auVar81._8_8_;
      auVar15._2_2_ = uStack_966;
      auVar15._0_2_ = local_978._2_2_;
      auVar80._0_4_ = CONCAT22(local_968,local_978._0_2_);
      auVar80._4_12_ = auVar15;
      auVar143._0_12_ = local_958._0_12_;
      auVar143._12_2_ = local_958._6_2_;
      auVar143._14_2_ = uStack_942;
      auVar142._12_4_ = auVar143._12_4_;
      auVar142._0_10_ = local_958._0_10_;
      auVar142._10_2_ = uStack_944;
      auVar141._10_6_ = auVar142._10_6_;
      auVar141._0_8_ = local_958._0_8_;
      auVar141._8_2_ = local_958._4_2_;
      auVar16._4_8_ = auVar141._8_8_;
      auVar16._2_2_ = uStack_946;
      auVar16._0_2_ = local_958._2_2_;
      uVar35 = CONCAT22(uStack_9a0,local_9b8._8_2_);
      auVar37._0_8_ = CONCAT26(uStack_99e,CONCAT24(local_9b8._10_2_,uVar35));
      auVar37._8_2_ = local_9b8._12_2_;
      auVar37._10_2_ = uStack_99c;
      auVar42._12_2_ = local_9b8._14_2_;
      auVar42._0_12_ = auVar37;
      auVar42._14_2_ = uStack_99a;
      uVar92 = CONCAT22(uStack_980,local_998._8_2_);
      auVar94._0_8_ = CONCAT26(uStack_97e,CONCAT24(local_998._10_2_,uVar92));
      auVar94._8_2_ = local_998._12_2_;
      auVar94._10_2_ = uStack_97c;
      auVar98._12_2_ = local_998._14_2_;
      auVar98._0_12_ = auVar94;
      auVar98._14_2_ = uStack_97a;
      uVar46 = CONCAT22(uStack_960,local_978._8_2_);
      auVar48._0_8_ = CONCAT26(uStack_95e,CONCAT24(local_978._10_2_,uVar46));
      auVar48._8_2_ = local_978._12_2_;
      auVar48._10_2_ = uStack_95c;
      auVar52._12_2_ = local_978._14_2_;
      auVar52._0_12_ = auVar48;
      auVar52._14_2_ = uStack_95a;
      uVar125 = CONCAT22(uStack_940,local_958._8_2_);
      auVar127._0_8_ = CONCAT26(uStack_93e,CONCAT24(local_958._10_2_,uVar125));
      auVar127._8_2_ = local_958._12_2_;
      auVar127._10_2_ = uStack_93c;
      auVar131._12_2_ = local_958._14_2_;
      auVar131._0_12_ = auVar127;
      auVar131._14_2_ = uStack_93a;
      auVar102._0_8_ = auVar64._0_8_;
      auVar102._8_4_ = auVar13._0_4_;
      auVar102._12_4_ = auVar14._0_4_;
      auVar106._0_8_ = auVar80._0_8_;
      auVar106._8_4_ = auVar15._0_4_;
      auVar106._12_4_ = auVar16._0_4_;
      auVar122._8_4_ = (int)((ulong)auVar37._0_8_ >> 0x20);
      auVar122._0_8_ = auVar37._0_8_;
      auVar122._12_4_ = (int)((ulong)auVar94._0_8_ >> 0x20);
      auVar135._8_4_ = (int)((ulong)auVar48._0_8_ >> 0x20);
      auVar135._0_8_ = auVar48._0_8_;
      auVar135._12_4_ = (int)((ulong)auVar127._0_8_ >> 0x20);
      local_638[lVar33 * 0x10] = CONCAT44(CONCAT22(local_988,local_998._0_2_),auVar64._0_4_);
      local_638[lVar33 * 0x10 + 1] = CONCAT44(CONCAT22(local_948,local_958._0_2_),auVar80._0_4_);
      local_638[lVar33 * 0x10 + 2] = auVar102._8_8_;
      (&uStack_618)[lVar33 * 0x10 + -1] = auVar106._8_8_;
      *(int *)(&uStack_618 + lVar33 * 0x10) = auVar65._8_4_;
      *(int *)((long)&uStack_618 + (lVar33 * 0x20 + 1) * 4) = auVar112._8_4_;
      *(int *)(&uStack_618 + lVar33 * 0x10 + 1) = auVar81._8_4_;
      *(int *)((long)&uStack_618 + (lVar33 * 0x20 + 3) * 4) = auVar141._8_4_;
      *(undefined4 *)(&uStack_618 + lVar33 * 0x10 + 3) = auVar66._12_4_;
      *(undefined4 *)((long)&uStack_618 + (lVar33 * 0x20 + 7) * 4) = auVar113._12_4_;
      *(undefined4 *)(&uStack_5f8 + lVar33 * 0x10) = auVar82._12_4_;
      *(undefined4 *)((long)&uStack_5f8 + lVar29 + 4) = auVar142._12_4_;
      (&uStack_5f8)[lVar33 * 0x10] = CONCAT44(uVar92,uVar35);
      auStack_5f0[lVar33 * 0x10] = CONCAT44(uVar125,uVar46);
      auStack_5f0[lVar33 * 0x10 + 1] = auVar122._8_8_;
      (&uStack_5d8)[lVar33 * 0x10 + -1] = auVar135._8_8_;
      *(int *)(&uStack_5d8 + lVar33 * 0x10) = auVar37._8_4_;
      *(int *)((long)&uStack_5d8 + (lVar33 * 0x20 + 1) * 4) = auVar94._8_4_;
      *(int *)(&uStack_5d8 + lVar33 * 0x10 + 1) = auVar48._8_4_;
      *(int *)((long)&uStack_5d8 + (lVar33 * 0x20 + 3) * 4) = auVar127._8_4_;
      *(int *)(&uStack_5d8 + lVar33 * 0x10 + 3) = auVar42._12_4_;
      *(int *)((long)&uStack_5d8 + (lVar33 * 0x20 + 7) * 4) = auVar98._12_4_;
      *(int *)(&uStack_5d8 + lVar33 * 0x10 + 4) = auVar52._12_4_;
      *(int *)((long)&uStack_5d8 + (lVar33 * 0x20 + 9) * 4) = auVar131._12_4_;
      auVar71._0_12_ = local_938._0_12_;
      auVar71._12_2_ = local_938._6_2_;
      auVar71._14_2_ = uStack_922;
      auVar70._12_4_ = auVar71._12_4_;
      auVar70._0_10_ = local_938._0_10_;
      auVar70._10_2_ = uStack_924;
      auVar69._10_6_ = auVar70._10_6_;
      auVar69._0_8_ = local_938._0_8_;
      auVar69._8_2_ = local_938._4_2_;
      auVar17._4_8_ = auVar69._8_8_;
      auVar17._2_2_ = uStack_926;
      auVar17._0_2_ = local_938._2_2_;
      auVar68._0_4_ = CONCAT22(local_928,local_938._0_2_);
      auVar68._4_12_ = auVar17;
      auVar117._0_12_ = local_918._0_12_;
      auVar117._12_2_ = local_918._6_2_;
      auVar117._14_2_ = uStack_902;
      auVar116._12_4_ = auVar117._12_4_;
      auVar116._0_10_ = local_918._0_10_;
      auVar116._10_2_ = uStack_904;
      auVar115._10_6_ = auVar116._10_6_;
      auVar115._0_8_ = local_918._0_8_;
      auVar115._8_2_ = local_918._4_2_;
      auVar18._4_8_ = auVar115._8_8_;
      auVar18._2_2_ = uStack_906;
      auVar18._0_2_ = local_918._2_2_;
      auVar87._0_12_ = local_8f8._0_12_;
      auVar87._12_2_ = local_8f8._6_2_;
      auVar87._14_2_ = uStack_8e2;
      auVar86._12_4_ = auVar87._12_4_;
      auVar86._0_10_ = local_8f8._0_10_;
      auVar86._10_2_ = uStack_8e4;
      auVar85._10_6_ = auVar86._10_6_;
      auVar85._0_8_ = local_8f8._0_8_;
      auVar85._8_2_ = local_8f8._4_2_;
      auVar19._4_8_ = auVar85._8_8_;
      auVar19._2_2_ = uStack_8e6;
      auVar19._0_2_ = local_8f8._2_2_;
      auVar84._0_4_ = CONCAT22(local_8e8,local_8f8._0_2_);
      auVar84._4_12_ = auVar19;
      auVar146._0_12_ = local_8d8._0_12_;
      auVar146._12_2_ = local_8d8._6_2_;
      auVar146._14_2_ = uStack_8c2;
      auVar145._12_4_ = auVar146._12_4_;
      auVar145._0_10_ = local_8d8._0_10_;
      auVar145._10_2_ = uStack_8c4;
      auVar144._10_6_ = auVar145._10_6_;
      auVar144._0_8_ = local_8d8._0_8_;
      auVar144._8_2_ = local_8d8._4_2_;
      auVar20._4_8_ = auVar144._8_8_;
      auVar20._2_2_ = uStack_8c6;
      auVar20._0_2_ = local_8d8._2_2_;
      uVar35 = CONCAT22(uStack_920,local_938._8_2_);
      auVar38._0_8_ = CONCAT26(uStack_91e,CONCAT24(local_938._10_2_,uVar35));
      auVar38._8_2_ = local_938._12_2_;
      auVar38._10_2_ = uStack_91c;
      auVar43._12_2_ = local_938._14_2_;
      auVar43._0_12_ = auVar38;
      auVar43._14_2_ = uStack_91a;
      uVar92 = CONCAT22(uStack_900,local_918._8_2_);
      auVar95._0_8_ = CONCAT26(uStack_8fe,CONCAT24(local_918._10_2_,uVar92));
      auVar95._8_2_ = local_918._12_2_;
      auVar95._10_2_ = uStack_8fc;
      auVar99._12_2_ = local_918._14_2_;
      auVar99._0_12_ = auVar95;
      auVar99._14_2_ = uStack_8fa;
      uVar46 = CONCAT22(uStack_8e0,local_8f8._8_2_);
      auVar49._0_8_ = CONCAT26(uStack_8de,CONCAT24(local_8f8._10_2_,uVar46));
      auVar49._8_2_ = local_8f8._12_2_;
      auVar49._10_2_ = uStack_8dc;
      auVar53._12_2_ = local_8f8._14_2_;
      auVar53._0_12_ = auVar49;
      auVar53._14_2_ = uStack_8da;
      uVar125 = CONCAT22(uStack_8c0,local_8d8._8_2_);
      auVar128._0_8_ = CONCAT26(uStack_8be,CONCAT24(local_8d8._10_2_,uVar125));
      auVar128._8_2_ = local_8d8._12_2_;
      auVar128._10_2_ = uStack_8bc;
      auVar132._12_2_ = local_8d8._14_2_;
      auVar132._0_12_ = auVar128;
      auVar132._14_2_ = uStack_8ba;
      auVar103._0_8_ = auVar68._0_8_;
      auVar103._8_4_ = auVar17._0_4_;
      auVar103._12_4_ = auVar18._0_4_;
      auVar107._0_8_ = auVar84._0_8_;
      auVar107._8_4_ = auVar19._0_4_;
      auVar107._12_4_ = auVar20._0_4_;
      auVar123._8_4_ = (int)((ulong)auVar38._0_8_ >> 0x20);
      auVar123._0_8_ = auVar38._0_8_;
      auVar123._12_4_ = (int)((ulong)auVar95._0_8_ >> 0x20);
      auVar136._8_4_ = (int)((ulong)auVar49._0_8_ >> 0x20);
      auVar136._0_8_ = auVar49._0_8_;
      auVar136._12_4_ = (int)((ulong)auVar128._0_8_ >> 0x20);
      auStack_438[lVar33 * 0x10] = CONCAT44(CONCAT22(local_908,local_918._0_2_),auVar68._0_4_);
      auStack_438[lVar33 * 0x10 + 1] = CONCAT44(CONCAT22(local_8c8,local_8d8._0_2_),auVar84._0_4_);
      auStack_438[lVar33 * 0x10 + 2] = auVar103._8_8_;
      (&uStack_418)[lVar33 * 0x10 + -1] = auVar107._8_8_;
      *(int *)(&uStack_418 + lVar33 * 0x10) = auVar69._8_4_;
      *(int *)((long)&uStack_418 + (lVar33 * 0x20 + 1) * 4) = auVar115._8_4_;
      *(int *)(&uStack_418 + lVar33 * 0x10 + 1) = auVar85._8_4_;
      *(int *)((long)&uStack_418 + (lVar33 * 0x20 + 3) * 4) = auVar144._8_4_;
      *(undefined4 *)(&uStack_418 + lVar33 * 0x10 + 3) = auVar70._12_4_;
      *(undefined4 *)((long)&uStack_418 + (lVar33 * 0x20 + 7) * 4) = auVar116._12_4_;
      *(undefined4 *)(&uStack_3f8 + lVar33 * 0x10) = auVar86._12_4_;
      *(undefined4 *)((long)&uStack_3f8 + lVar29 + 4) = auVar145._12_4_;
      (&uStack_3f8)[lVar33 * 0x10] = CONCAT44(uVar92,uVar35);
      auStack_3f0[lVar33 * 0x10] = CONCAT44(uVar125,uVar46);
      auStack_3f0[lVar33 * 0x10 + 1] = auVar123._8_8_;
      (&uStack_3d8)[lVar33 * 0x10 + -1] = auVar136._8_8_;
      *(int *)(&uStack_3d8 + lVar33 * 0x10) = auVar38._8_4_;
      *(int *)((long)&uStack_3d8 + (lVar33 * 0x20 + 1) * 4) = auVar95._8_4_;
      *(int *)(&uStack_3d8 + lVar33 * 0x10 + 1) = auVar49._8_4_;
      *(int *)((long)&uStack_3d8 + (lVar33 * 0x20 + 3) * 4) = auVar128._8_4_;
      *(int *)(&uStack_3d8 + lVar33 * 0x10 + 3) = auVar43._12_4_;
      *(int *)((long)&uStack_3d8 + (lVar33 * 0x20 + 7) * 4) = auVar99._12_4_;
      *(int *)(&uStack_3d8 + lVar33 * 0x10 + 4) = auVar53._12_4_;
      *(int *)((long)&uStack_3d8 + (lVar33 * 0x20 + 9) * 4) = auVar132._12_4_;
      auVar75._0_12_ = local_8b8._0_12_;
      auVar75._12_2_ = local_8b8._6_2_;
      auVar75._14_2_ = uStack_8a2;
      auVar74._12_4_ = auVar75._12_4_;
      auVar74._0_10_ = local_8b8._0_10_;
      auVar74._10_2_ = uStack_8a4;
      auVar73._10_6_ = auVar74._10_6_;
      auVar73._0_8_ = local_8b8._0_8_;
      auVar73._8_2_ = local_8b8._4_2_;
      auVar21._4_8_ = auVar73._8_8_;
      auVar21._2_2_ = uStack_8a6;
      auVar21._0_2_ = local_8b8._2_2_;
      auVar72._0_4_ = CONCAT22(local_8a8,local_8b8._0_2_);
      auVar72._4_12_ = auVar21;
      auVar120._0_12_ = local_898._0_12_;
      auVar120._12_2_ = local_898._6_2_;
      auVar120._14_2_ = uStack_882;
      auVar119._12_4_ = auVar120._12_4_;
      auVar119._0_10_ = local_898._0_10_;
      auVar119._10_2_ = uStack_884;
      auVar118._10_6_ = auVar119._10_6_;
      auVar118._0_8_ = local_898._0_8_;
      auVar118._8_2_ = local_898._4_2_;
      auVar22._4_8_ = auVar118._8_8_;
      auVar22._2_2_ = uStack_886;
      auVar22._0_2_ = local_898._2_2_;
      auVar91._0_12_ = local_878._0_12_;
      auVar91._12_2_ = local_878._6_2_;
      auVar91._14_2_ = uStack_862;
      auVar90._12_4_ = auVar91._12_4_;
      auVar90._0_10_ = local_878._0_10_;
      auVar90._10_2_ = uStack_864;
      auVar89._10_6_ = auVar90._10_6_;
      auVar89._0_8_ = local_878._0_8_;
      auVar89._8_2_ = local_878._4_2_;
      auVar23._4_8_ = auVar89._8_8_;
      auVar23._2_2_ = uStack_866;
      auVar23._0_2_ = local_878._2_2_;
      auVar88._0_4_ = CONCAT22(local_868,local_878._0_2_);
      auVar88._4_12_ = auVar23;
      auVar149._0_12_ = local_858._0_12_;
      auVar149._12_2_ = local_858._6_2_;
      auVar149._14_2_ = uStack_842;
      auVar148._12_4_ = auVar149._12_4_;
      auVar148._0_10_ = local_858._0_10_;
      auVar148._10_2_ = uStack_844;
      auVar147._10_6_ = auVar148._10_6_;
      auVar147._0_8_ = local_858._0_8_;
      auVar147._8_2_ = local_858._4_2_;
      auVar24._4_8_ = auVar147._8_8_;
      auVar24._2_2_ = uStack_846;
      auVar24._0_2_ = local_858._2_2_;
      uVar35 = CONCAT22(uStack_8a0,local_8b8._8_2_);
      auVar39._0_8_ = CONCAT26(uStack_89e,CONCAT24(local_8b8._10_2_,uVar35));
      auVar39._8_2_ = local_8b8._12_2_;
      auVar39._10_2_ = uStack_89c;
      auVar44._12_2_ = local_8b8._14_2_;
      auVar44._0_12_ = auVar39;
      auVar44._14_2_ = uStack_89a;
      uVar92 = CONCAT22(uStack_880,local_898._8_2_);
      auVar96._0_8_ = CONCAT26(uStack_87e,CONCAT24(local_898._10_2_,uVar92));
      auVar96._8_2_ = local_898._12_2_;
      auVar96._10_2_ = uStack_87c;
      auVar100._12_2_ = local_898._14_2_;
      auVar100._0_12_ = auVar96;
      auVar100._14_2_ = uStack_87a;
      uVar46 = CONCAT22(uStack_860,local_878._8_2_);
      auVar50._0_8_ = CONCAT26(uStack_85e,CONCAT24(local_878._10_2_,uVar46));
      auVar50._8_2_ = local_878._12_2_;
      auVar50._10_2_ = uStack_85c;
      auVar54._12_2_ = local_878._14_2_;
      auVar54._0_12_ = auVar50;
      auVar54._14_2_ = uStack_85a;
      uVar125 = CONCAT22(uStack_840,local_858._8_2_);
      auVar129._0_8_ = CONCAT26(uStack_83e,CONCAT24(local_858._10_2_,uVar125));
      auVar129._8_2_ = local_858._12_2_;
      auVar129._10_2_ = uStack_83c;
      auVar133._12_2_ = local_858._14_2_;
      auVar133._0_12_ = auVar129;
      auVar133._14_2_ = uStack_83a;
      auVar104._0_8_ = auVar72._0_8_;
      auVar104._8_4_ = auVar21._0_4_;
      auVar104._12_4_ = auVar22._0_4_;
      auVar108._0_8_ = auVar88._0_8_;
      auVar108._8_4_ = auVar23._0_4_;
      auVar108._12_4_ = auVar24._0_4_;
      auVar124._8_4_ = (int)((ulong)auVar39._0_8_ >> 0x20);
      auVar124._0_8_ = auVar39._0_8_;
      auVar124._12_4_ = (int)((ulong)auVar96._0_8_ >> 0x20);
      auVar137._8_4_ = (int)((ulong)auVar50._0_8_ >> 0x20);
      auVar137._0_8_ = auVar50._0_8_;
      auVar137._12_4_ = (int)((ulong)auVar129._0_8_ >> 0x20);
      auStack_238[lVar33 * 0x10] = CONCAT44(CONCAT22(local_888,local_898._0_2_),auVar72._0_4_);
      auStack_238[lVar33 * 0x10 + 1] = CONCAT44(CONCAT22(local_848,local_858._0_2_),auVar88._0_4_);
      auStack_238[lVar33 * 0x10 + 2] = auVar104._8_8_;
      (&uStack_218)[lVar33 * 0x10 + -1] = auVar108._8_8_;
      *(int *)(&uStack_218 + lVar33 * 0x10) = auVar73._8_4_;
      *(int *)((long)&uStack_218 + (lVar33 * 0x20 + 1) * 4) = auVar118._8_4_;
      *(int *)(&uStack_218 + lVar33 * 0x10 + 1) = auVar89._8_4_;
      *(int *)((long)&uStack_218 + (lVar33 * 0x20 + 3) * 4) = auVar147._8_4_;
      *(undefined4 *)(&uStack_218 + lVar33 * 0x10 + 3) = auVar74._12_4_;
      *(undefined4 *)((long)&uStack_218 + (lVar33 * 0x20 + 7) * 4) = auVar119._12_4_;
      *(undefined4 *)(&uStack_1f8 + lVar33 * 0x10) = auVar90._12_4_;
      *(undefined4 *)((long)&uStack_1f8 + lVar29 + 4) = auVar148._12_4_;
      (&uStack_1f8)[lVar33 * 0x10] = CONCAT44(uVar92,uVar35);
      auStack_1f0[lVar33 * 0x10] = CONCAT44(uVar125,uVar46);
      auStack_1f0[lVar33 * 0x10 + 1] = auVar124._8_8_;
      (&uStack_1d8)[lVar33 * 0x10 + -1] = auVar137._8_8_;
      *(int *)(&uStack_1d8 + lVar33 * 0x10) = auVar39._8_4_;
      *(int *)((long)&uStack_1d8 + (lVar33 * 0x20 + 1) * 4) = auVar96._8_4_;
      *(int *)(&uStack_1d8 + lVar33 * 0x10 + 1) = auVar50._8_4_;
      *(int *)((long)&uStack_1d8 + (lVar33 * 0x20 + 3) * 4) = auVar129._8_4_;
      *(int *)(&uStack_1d8 + lVar33 * 0x10 + 3) = auVar44._12_4_;
      *(int *)((long)&uStack_1d8 + (lVar33 * 0x20 + 7) * 4) = auVar100._12_4_;
      *(int *)(&uStack_1d8 + lVar33 * 0x10 + 4) = auVar54._12_4_;
      *(int *)((long)&uStack_1d8 + (lVar33 * 0x20 + 9) * 4) = auVar133._12_4_;
      lVar33 = lVar33 + 1;
      input = input + 8;
    } while (lVar33 != 4);
    piVar31 = output + 4;
    puVar34 = local_838;
    lVar33 = 0;
    do {
      if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
        lVar29 = 0x200;
        puVar30 = puVar34;
        do {
          uVar8 = puVar30[1];
          *(undefined8 *)((long)local_a48 + lVar29) = *puVar30;
          *(undefined8 *)((long)local_a48 + lVar29 + 8) = uVar8;
          puVar30 = puVar30 + 2;
          lVar29 = lVar29 + -0x10;
        } while (lVar29 != 0);
        puVar30 = local_a38;
      }
      else {
        puVar30 = local_838 + lVar33 * 0x40;
      }
      (*local_a48[1])(puVar30,puVar30,0xc);
      auVar55._8_8_ = extraout_XMM1_Qb;
      auVar55._0_8_ = extraout_XMM1_Qa;
      bVar3 = piVar26[2];
      uVar28 = (uint)(char)bVar3;
      if ((int)uVar28 < 0) {
        auVar40 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
        auVar40 = pshuflw(auVar40,auVar40,0);
        auVar45._0_4_ = auVar40._0_4_;
        auVar45._4_4_ = auVar45._0_4_;
        auVar45._8_4_ = auVar45._0_4_;
        auVar45._12_4_ = auVar45._0_4_;
        lVar29 = 0;
        do {
          auVar40 = paddsw(*(undefined1 (*) [16])((long)puVar30 + lVar29),auVar45);
          auVar55 = psraw(auVar40,ZEXT416(-uVar28));
          *(undefined1 (*) [16])((long)puVar30 + lVar29) = auVar55;
          lVar29 = lVar29 + 0x10;
        } while (lVar29 != 0x200);
      }
      else if (bVar3 != 0) {
        lVar29 = 0;
        do {
          auVar55 = ZEXT416(uVar28);
          auVar40 = psllw(*(undefined1 (*) [16])((long)puVar30 + lVar29),auVar55);
          *(undefined1 (*) [16])((long)puVar30 + lVar29) = auVar40;
          lVar29 = lVar29 + 0x10;
        } while (lVar29 != 0x200);
      }
      lVar29 = 0;
      do {
        psVar1 = (short *)((long)puVar30 + lVar29);
        sVar4 = psVar1[4];
        sVar5 = psVar1[5];
        sVar6 = psVar1[6];
        sVar7 = psVar1[7];
        auVar58._0_12_ = auVar55._0_12_;
        auVar58._12_2_ = auVar55._6_2_;
        auVar58._14_2_ = psVar1[3];
        auVar57._12_4_ = auVar58._12_4_;
        auVar57._0_10_ = auVar55._0_10_;
        auVar57._10_2_ = psVar1[2];
        auVar56._10_6_ = auVar57._10_6_;
        auVar56._0_8_ = auVar55._0_8_;
        auVar56._8_2_ = auVar55._4_2_;
        auVar25._4_8_ = auVar56._8_8_;
        auVar25._2_2_ = psVar1[1];
        auVar25._0_2_ = auVar55._2_2_;
        auVar55._0_4_ = (int)*psVar1;
        auVar55._4_4_ = auVar25._0_4_ >> 0x10;
        auVar55._8_4_ = auVar56._8_4_ >> 0x10;
        auVar55._12_4_ = auVar57._12_4_ >> 0x10;
        *(undefined1 (*) [16])(piVar31 + lVar29 * 2 + -4) = auVar55;
        piVar2 = piVar31 + lVar29 * 2;
        *piVar2 = (int)sVar4;
        piVar2[1] = (int)sVar5;
        piVar2[2] = (int)sVar6;
        piVar2[3] = (int)sVar7;
        lVar29 = lVar29 + 0x10;
      } while (lVar29 != 0x200);
      lVar33 = lVar33 + 1;
      puVar34 = puVar34 + 0x40;
      piVar31 = piVar31 + 8;
    } while (lVar33 != 4);
    return;
  }
  av1_fwd_txfm2d_32x32_c(input,output,stride,tx_type,bd);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_32x32_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[32], buf1[128];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X32];
  const int txw_idx = get_txw_idx(TX_32X32);
  const int txh_idx = get_txh_idx(TX_32X32);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 32;
  const int height = 32;
  const transform_1d_sse2 col_txfm = col_txfm8x32_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x32_arr[tx_type];

  if (col_txfm != NULL && row_txfm != NULL) {
    int ud_flip, lr_flip;
    get_flip_cfg(tx_type, &ud_flip, &lr_flip);

    for (int i = 0; i < 4; i++) {
      if (ud_flip) {
        load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
      } else {
        load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
      }
      round_shift_16bit(buf0, height, shift[0]);
      col_txfm(buf0, buf0, cos_bit_col);
      round_shift_16bit(buf0, height, shift[1]);
      transpose_16bit_8x8(buf0 + 0 * 8, buf1 + 0 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 1 * 8, buf1 + 1 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 2 * 8, buf1 + 2 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 3 * 8, buf1 + 3 * width + 8 * i);
    }

    for (int i = 0; i < 4; i++) {
      __m128i *buf;
      if (lr_flip) {
        buf = buf0;
        flip_buf_sse2(buf1 + width * i, buf, width);
      } else {
        buf = buf1 + width * i;
      }
      row_txfm(buf, buf, cos_bit_row);
      round_shift_16bit(buf, width, shift[2]);
      store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
    }
  } else {
    av1_fwd_txfm2d_32x32_c(input, output, stride, tx_type, bd);
  }
}